

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O2

uint64_t aom_var_2d_u16_avx2(uint8_t *src,int src_stride,int width,int height)

{
  undefined1 auVar1 [32];
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  undefined1 (*pauVar16) [32];
  long lVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  __m256i vsrc [8];
  undefined8 local_120 [33];
  
  lVar11 = (long)src_stride * 2;
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  lVar14 = (long)src * 2;
  for (lVar13 = 0; lVar13 < width + -0xf; lVar13 = lVar13 + 0x10) {
    pauVar16 = (undefined1 (*) [32])((long)src * 2 + lVar13 * 2);
    iVar12 = 0;
    while( true ) {
      auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if (height + -8 <= iVar12) break;
      for (lVar17 = 0; lVar17 != 0x100; lVar17 = lVar17 + 0x20) {
        uVar8 = *(undefined8 *)(*pauVar16 + 8);
        uVar9 = *(undefined8 *)(*pauVar16 + 0x10);
        uVar10 = *(undefined8 *)(*pauVar16 + 0x18);
        *(undefined8 *)((long)local_120 + lVar17) = *(undefined8 *)*pauVar16;
        *(undefined8 *)((long)local_120 + lVar17 + 8) = uVar8;
        *(undefined8 *)((long)local_120 + lVar17 + 0x10) = uVar9;
        *(undefined8 *)((long)local_120 + lVar17 + 0x18) = uVar10;
        pauVar16 = (undefined1 (*) [32])(*pauVar16 + lVar11);
      }
      auVar20 = ZEXT1664((undefined1  [16])0x0);
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      for (lVar17 = 0; lVar17 != 0x100; lVar17 = lVar17 + 0x20) {
        auVar1 = *(undefined1 (*) [32])((long)local_120 + lVar17);
        auVar7 = vpunpcklwd_avx2(auVar1,auVar19);
        auVar6 = vpunpckhwd_avx2(auVar1,auVar19);
        auVar7 = vpaddd_avx2(auVar21._0_32_,auVar7);
        auVar7 = vpaddd_avx2(auVar7,auVar6);
        auVar21 = ZEXT3264(auVar7);
        auVar1 = vpmaddwd_avx2(auVar1,auVar1);
        auVar1 = vpaddd_avx2(auVar1,auVar20._0_32_);
        auVar20 = ZEXT3264(auVar1);
      }
      auVar3 = vpaddd_avx(auVar21._16_16_,auVar21._0_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpaddd_avx(auVar3,auVar4);
      auVar4 = vpaddd_avx(auVar20._16_16_,auVar20._0_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpaddd_avx(auVar4,auVar5);
      auVar3 = vphaddd_avx(auVar4,auVar3);
      auVar3 = vpshufd_avx(auVar3,0xe8);
      auVar3 = vpmovsxdq_avx(auVar3);
      auVar3 = vpaddq_avx(auVar18._0_16_,auVar3);
      auVar18 = ZEXT1664(auVar3);
      iVar12 = iVar12 + 8;
    }
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    for (; iVar12 < height; iVar12 = iVar12 + 1) {
      auVar1 = *pauVar16;
      auVar7 = vpunpcklwd_avx2(auVar1,auVar19);
      auVar6 = vpunpckhwd_avx2(auVar1,auVar19);
      auVar7 = vpaddd_avx2(auVar21._0_32_,auVar7);
      auVar7 = vpaddd_avx2(auVar7,auVar6);
      auVar21 = ZEXT3264(auVar7);
      auVar1 = vpmaddwd_avx2(auVar1,auVar1);
      auVar1 = vpaddd_avx2(auVar1,auVar20._0_32_);
      auVar20 = ZEXT3264(auVar1);
      pauVar16 = (undefined1 (*) [32])(*pauVar16 + lVar11);
    }
    auVar3 = vpaddd_avx(auVar21._16_16_,auVar21._0_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddd_avx(auVar3,auVar4);
    auVar4 = vpaddd_avx(auVar20._16_16_,auVar20._0_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpaddd_avx(auVar4,auVar5);
    auVar3 = vphaddd_avx(auVar4,auVar3);
    auVar3 = vpshufd_avx(auVar3,0xe8);
    auVar3 = vpmovsxdq_avx(auVar3);
    auVar3 = vpaddq_avx(auVar18._0_16_,auVar3);
    auVar18 = ZEXT1664(auVar3);
    lVar14 = lVar14 + 0x20;
  }
  iVar15 = 0;
  iVar12 = 0;
  if (0 < height) {
    iVar12 = height;
  }
  for (; iVar15 != iVar12; iVar15 = iVar15 + 1) {
    for (lVar17 = 0; lVar13 + lVar17 < (long)width; lVar17 = lVar17 + 1) {
      uVar2 = *(ushort *)(lVar14 + lVar17 * 2);
      auVar3 = vpunpcklqdq_avx(ZEXT416((uint)uVar2 * (uint)uVar2),ZEXT416((uint)uVar2));
      auVar3 = vpaddq_avx(auVar18._0_16_,auVar3);
      auVar18 = ZEXT1664(auVar3);
    }
    lVar14 = lVar14 + lVar11;
  }
  lVar11 = vpextrq_avx(auVar18._0_16_,1);
  return auVar18._0_8_ - (ulong)(lVar11 * lVar11) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u16_avx2(uint8_t *src, int src_stride, int width,
                             int height) {
  uint16_t *srcp1 = CONVERT_TO_SHORTPTR(src), *srcp;
  uint64_t s = 0, ss = 0;
  __m256i vzero = _mm256_setzero_si256();
  __m256i v_acc_sum = vzero;
  __m256i v_acc_sqs = vzero;
  int i, j;

  // Process 16 elements in a row
  for (i = 0; i < width - 15; i += 16) {
    srcp = srcp1 + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 8; j += 8) {
      __m256i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm256_loadu_si256((__m256i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m256i vsrc0 = _mm256_unpacklo_epi16(vsrc[k], vzero);
        __m256i vsrc1 = _mm256_unpackhi_epi16(vsrc[k], vzero);
        v_acc_sum = _mm256_add_epi32(vsrc0, v_acc_sum);
        v_acc_sum = _mm256_add_epi32(vsrc1, v_acc_sum);

        __m256i vsqs0 = _mm256_madd_epi16(vsrc[k], vsrc[k]);
        v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
      }

      // Update total sum and clear the vectors
      s += mm256_accumulate_epi32(v_acc_sum);
      ss += mm256_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m256i vsrc = _mm256_loadu_si256((__m256i *)srcp);
      __m256i vsrc0 = _mm256_unpacklo_epi16(vsrc, vzero);
      __m256i vsrc1 = _mm256_unpackhi_epi16(vsrc, vzero);
      v_acc_sum = _mm256_add_epi32(vsrc0, v_acc_sum);
      v_acc_sum = _mm256_add_epi32(vsrc1, v_acc_sum);

      __m256i vsqs0 = _mm256_madd_epi16(vsrc, vsrc);
      v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm256_accumulate_epi32(v_acc_sum);
    ss += mm256_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = srcp1;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint16_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}